

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O2

int XMLDoc_parse_buffer_SAX_len
              (SXML_CHAR *buffer,int buffer_len,SXML_CHAR *name,SAX_Callbacks *sax,void *user)

{
  int iVar1;
  DataSourceBuffer dsb;
  SAX_Data local_28;
  
  dsb.cur_pos = 0;
  local_28.line_num = 0;
  local_28._12_4_ = 0;
  iVar1 = 0;
  if (buffer != (SXML_CHAR *)0x0 && sax != (SAX_Callbacks *)0x0) {
    local_28.type = DATA_SOURCE_BUFFER;
    local_28._28_4_ = 0;
    dsb.buf = buffer;
    dsb.buf_len = buffer_len;
    local_28.name = name;
    local_28.user = user;
    local_28.src = buffer;
    iVar1 = _parse_data_SAX(&dsb,DATA_SOURCE_BUFFER,sax,&local_28);
  }
  return iVar1;
}

Assistant:

int XMLDoc_parse_buffer_SAX_len(const SXML_CHAR* buffer, int buffer_len, const SXML_CHAR* name, const SAX_Callbacks* sax, void* user)
{
	DataSourceBuffer dsb = { buffer, buffer_len, 0 };
	SAX_Data sd = { NULL };

	if (sax == NULL || buffer == NULL)
		return FALSE;

	sd.name = name;
	sd.user = user;
	sd.type = DATA_SOURCE_BUFFER;
	sd.src  = (void*)buffer;
	return _parse_data_SAX((void*)&dsb, DATA_SOURCE_BUFFER, sax, &sd);
}